

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderBindingTableBase.hpp
# Opt level: O1

void __thiscall
Diligent::ShaderBindingTableBase<Diligent::EngineVkImplTraits>::GetData
          (ShaderBindingTableBase<Diligent::EngineVkImplTraits> *this,BufferImplType **pSBTBuffer,
          BindingTable *RaygenShaderBindingTable,BindingTable *MissShaderBindingTable,
          BindingTable *HitShaderBindingTable,BindingTable *CallableShaderBindingTable)

{
  RefCntAutoPtr<Diligent::BufferVkImpl> *this_00;
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  BufferVkImpl *pBVar6;
  uint uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  RenderDeviceVkImpl *pRVar10;
  long *plVar11;
  uint uVar12;
  long *plVar13;
  char (*Args_1) [21];
  pointer puVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  string msg;
  String BuffName;
  string msg_4;
  undefined1 local_d8 [32];
  Uint64 local_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined8 local_90;
  undefined1 local_88 [32];
  BindingTable *local_68;
  BindingTable *local_60;
  BindingTable *local_58;
  BindingTable *local_50;
  BufferImplType **local_48;
  long local_40;
  uint local_38;
  undefined4 uStack_34;
  
  local_68 = RaygenShaderBindingTable;
  local_60 = MissShaderBindingTable;
  local_58 = HitShaderBindingTable;
  local_50 = CallableShaderBindingTable;
  local_48 = pSBTBuffer;
  pRVar10 = DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
            ::GetDevice(&this->
                         super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
                       );
  lVar17 = (long)(this->m_RayGenShaderRecord).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->m_RayGenShaderRecord).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  uVar16 = (pRVar10->
           super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
           ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.RayTracing.
           ShaderGroupBaseAlignment;
  uVar12 = uVar16 - (uVar16 >> 1 & 0x55555555);
  uVar12 = (uVar12 >> 2 & 0x33333333) + (uVar12 & 0x33333333);
  uVar12 = ((uVar12 >> 4) + uVar12 & 0xf0f0f0f) * 0x1010101 >> 0x18;
  local_b0._0_4_ = uVar16;
  if (uVar12 != 1) {
    FormatString<char[12],unsigned_int,char[23]>
              ((string *)local_d8,(Diligent *)"Alignment (",(char (*) [12])&local_b0,
               (uint *)") must be a power of 2",(char (*) [23])HitShaderBindingTable);
    DebugAssertionFailed
              ((Char *)local_d8._0_8_,"AlignUp",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
               ,0x34);
    if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
      operator_delete((void *)local_d8._0_8_,CONCAT44(local_d8._20_4_,local_d8._16_4_) + 1);
    }
  }
  local_90._0_4_ = (uint)local_b0;
  local_90._4_4_ = 0;
  puVar1 = (this->m_MissShadersRecord).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = (this->m_MissShadersRecord).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_b0._0_4_ = uVar16;
  if (uVar12 != 1) {
    FormatString<char[12],unsigned_int,char[23]>
              ((string *)local_d8,(Diligent *)"Alignment (",(char (*) [12])&local_b0,
               (uint *)") must be a power of 2",(char (*) [23])HitShaderBindingTable);
    DebugAssertionFailed
              ((Char *)local_d8._0_8_,"AlignUp",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
               ,0x34);
    if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
      operator_delete((void *)local_d8._0_8_,CONCAT44(local_d8._20_4_,local_d8._16_4_) + 1);
    }
  }
  local_38 = (uint)local_b0;
  uStack_34 = 0;
  puVar14 = (this->m_HitGroupsRecord).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish;
  puVar3 = (this->m_HitGroupsRecord).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_40 = lVar17;
  local_b0._0_4_ = uVar16;
  if (uVar12 != 1) {
    FormatString<char[12],unsigned_int,char[23]>
              ((string *)local_d8,(Diligent *)"Alignment (",(char (*) [12])&local_b0,
               (uint *)") must be a power of 2",(char (*) [23])HitShaderBindingTable);
    DebugAssertionFailed
              ((Char *)local_d8._0_8_,"AlignUp",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
               ,0x34);
    if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
      operator_delete((void *)local_d8._0_8_,CONCAT44(local_d8._20_4_,local_d8._16_4_) + 1);
    }
  }
  uVar7 = (uint)local_b0;
  puVar4 = (this->m_CallableShadersRecord).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar5 = (this->m_CallableShadersRecord).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_b0 = (long *)CONCAT44(local_b0._4_4_,uVar16);
  if (uVar12 != 1) {
    FormatString<char[12],unsigned_int,char[23]>
              ((string *)local_d8,(Diligent *)"Alignment (",(char (*) [12])&local_b0,
               (uint *)") must be a power of 2",(char (*) [23])HitShaderBindingTable);
    DebugAssertionFailed
              ((Char *)local_d8._0_8_,"AlignUp",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
               ,0x34);
    if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
      operator_delete((void *)local_d8._0_8_,CONCAT44(local_d8._20_4_,local_d8._16_4_) + 1);
    }
  }
  uVar12 = -(uint)local_90 & ((int)local_40 + (uint)local_90) - 1;
  uVar18 = -local_38 & (local_38 + ((int)puVar1 - (int)puVar2) + uVar12) - 1;
  uVar16 = -uVar7 & (uVar7 + ((int)puVar14 - (int)puVar3) + uVar18) - 1;
  local_90 = (ulong)uVar16;
  this_00 = &this->m_pBuffer;
  pBVar6 = (this->m_pBuffer).m_pObject;
  uVar15 = (ulong)(-(uint)local_b0 & ((uint)local_b0 + ((int)puVar4 - (int)puVar5) + uVar16) - 1);
  if ((pBVar6 == (BufferVkImpl *)0x0) ||
     ((pBVar6->super_BufferBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
      .m_Desc.Size < uVar15)) {
    RefCntAutoPtr<Diligent::BufferVkImpl>::operator=(this_00,(BufferVkImpl *)0x0);
    std::__cxx11::string::string
              ((string *)local_d8,
               (this->
               super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
               ).m_Desc.super_DeviceObjectAttribs.Name,(allocator *)local_88);
    plVar11 = (long *)std::__cxx11::string::append(local_d8);
    local_b0 = &local_a0;
    plVar13 = plVar11 + 2;
    if ((long *)*plVar11 == plVar13) {
      local_a0 = *plVar13;
      lStack_98 = plVar11[3];
    }
    else {
      local_a0 = *plVar13;
      local_b0 = (long *)*plVar11;
    }
    local_a8 = plVar11[1];
    *plVar11 = (long)plVar13;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
      operator_delete((void *)local_d8._0_8_,CONCAT44(local_d8._20_4_,local_d8._16_4_) + 1);
    }
    local_d8._20_4_ = 1;
    local_d8._24_4_ = 0;
    local_b8 = 1;
    local_d8._0_8_ = local_b0;
    local_d8._16_4_ = 0x400;
    local_d8._8_8_ = uVar15;
    pRVar10 = DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
              ::GetDevice(&this->
                           super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
                         );
    local_88._0_8_ = this_00->m_pObject;
    Args_1 = (char (*) [21])local_88;
    local_88._8_8_ = this_00;
    RenderDeviceVkImpl::CreateBuffer
              (pRVar10,(BufferDesc *)local_d8,(BufferData *)0x0,(IBuffer **)Args_1);
    uVar9 = local_88._8_8_;
    uVar8 = local_88._0_8_;
    if (((RefCntAutoPtr<Diligent::BufferVkImpl> *)local_88._8_8_ !=
         (RefCntAutoPtr<Diligent::BufferVkImpl> *)0x0) &&
       (*(BufferVkImpl **)local_88._8_8_ != (BufferVkImpl *)local_88._0_8_)) {
      RefCntAutoPtr<Diligent::BufferVkImpl>::Release
                ((RefCntAutoPtr<Diligent::BufferVkImpl> *)local_88._8_8_);
      *(BufferVkImpl **)uVar9 = (BufferVkImpl *)uVar8;
    }
    if (this_00->m_pObject == (BufferVkImpl *)0x0) {
      FormatString<char[26],char[21]>
                ((string *)local_88,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_pBuffer != nullptr",Args_1);
      DebugAssertionFailed
                ((Char *)local_88._0_8_,"GetData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
                 ,0x1dd);
      if ((BufferVkImpl *)local_88._0_8_ != (BufferVkImpl *)(local_88 + 0x10)) {
        operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
      }
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
    uVar16 = (uint)local_90;
  }
  if (this_00->m_pObject != (BufferImplType *)0x0) {
    *local_48 = this_00->m_pObject;
    puVar1 = (this->m_RayGenShaderRecord).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->m_RayGenShaderRecord).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar1 != puVar2) {
      puVar14 = (pointer)0x0;
      if (this->m_Changed != false) {
        puVar14 = puVar1;
      }
      local_68->pData = puVar14;
      local_68->Offset = 0;
      local_68->Size = (int)puVar2 - (int)puVar1;
      local_68->Stride = this->m_ShaderRecordStride;
    }
    puVar1 = (this->m_MissShadersRecord).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->m_MissShadersRecord).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar1 != puVar2) {
      puVar14 = (pointer)0x0;
      if (this->m_Changed != false) {
        puVar14 = puVar1;
      }
      local_60->pData = puVar14;
      local_60->Offset = uVar12;
      local_60->Size = (int)puVar2 - (int)puVar1;
      local_60->Stride = this->m_ShaderRecordStride;
    }
    puVar1 = (this->m_HitGroupsRecord).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->m_HitGroupsRecord).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar1 != puVar2) {
      puVar14 = (pointer)0x0;
      if (this->m_Changed != false) {
        puVar14 = puVar1;
      }
      local_58->pData = puVar14;
      local_58->Offset = uVar18;
      local_58->Size = (int)puVar2 - (int)puVar1;
      local_58->Stride = this->m_ShaderRecordStride;
    }
    puVar1 = (this->m_CallableShadersRecord).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->m_CallableShadersRecord).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar1 != puVar2) {
      puVar14 = (pointer)0x0;
      if (this->m_Changed != false) {
        puVar14 = puVar1;
      }
      local_50->pData = puVar14;
      local_50->Offset = uVar16;
      local_50->Size = (int)puVar2 - (int)puVar1;
      local_50->Stride = this->m_ShaderRecordStride;
    }
    this->m_Changed = false;
  }
  return;
}

Assistant:

void GetData(BufferImplType*& pSBTBuffer,
                 BindingTable&    RaygenShaderBindingTable,
                 BindingTable&    MissShaderBindingTable,
                 BindingTable&    HitShaderBindingTable,
                 BindingTable&    CallableShaderBindingTable)
    {
        const Uint32 ShaderGroupBaseAlignment = this->GetDevice()->GetAdapterInfo().RayTracing.ShaderGroupBaseAlignment;

        const auto AlignToLarger = [ShaderGroupBaseAlignment](size_t offset) -> Uint32 {
            return AlignUp(static_cast<Uint32>(offset), ShaderGroupBaseAlignment);
        };

        const Uint32 RayGenOffset          = 0;
        const Uint32 MissShaderOffset      = AlignToLarger(m_RayGenShaderRecord.size());
        const Uint32 HitGroupOffset        = AlignToLarger(MissShaderOffset + m_MissShadersRecord.size());
        const Uint32 CallableShadersOffset = AlignToLarger(HitGroupOffset + m_HitGroupsRecord.size());
        const Uint32 BufSize               = AlignToLarger(CallableShadersOffset + m_CallableShadersRecord.size());

        // Recreate buffer
        if (m_pBuffer == nullptr || m_pBuffer->GetDesc().Size < BufSize)
        {
            m_pBuffer = nullptr;

            String     BuffName = String{this->m_Desc.Name} + " - internal buffer";
            BufferDesc BuffDesc;
            BuffDesc.Name      = BuffName.c_str();
            BuffDesc.Usage     = USAGE_DEFAULT;
            BuffDesc.BindFlags = BIND_RAY_TRACING;
            BuffDesc.Size      = BufSize;

            this->GetDevice()->CreateBuffer(BuffDesc, nullptr, m_pBuffer.template DblPtr<IBuffer>());
            VERIFY_EXPR(m_pBuffer != nullptr);
        }

        if (m_pBuffer == nullptr)
            return; // Something went wrong

        pSBTBuffer = m_pBuffer;

        if (!m_RayGenShaderRecord.empty())
        {
            RaygenShaderBindingTable.pData  = m_Changed ? m_RayGenShaderRecord.data() : nullptr;
            RaygenShaderBindingTable.Offset = RayGenOffset;
            RaygenShaderBindingTable.Size   = static_cast<Uint32>(m_RayGenShaderRecord.size());
            RaygenShaderBindingTable.Stride = this->m_ShaderRecordStride;
        }

        if (!m_MissShadersRecord.empty())
        {
            MissShaderBindingTable.pData  = m_Changed ? m_MissShadersRecord.data() : nullptr;
            MissShaderBindingTable.Offset = MissShaderOffset;
            MissShaderBindingTable.Size   = static_cast<Uint32>(m_MissShadersRecord.size());
            MissShaderBindingTable.Stride = this->m_ShaderRecordStride;
        }

        if (!m_HitGroupsRecord.empty())
        {
            HitShaderBindingTable.pData  = m_Changed ? m_HitGroupsRecord.data() : nullptr;
            HitShaderBindingTable.Offset = HitGroupOffset;
            HitShaderBindingTable.Size   = static_cast<Uint32>(m_HitGroupsRecord.size());
            HitShaderBindingTable.Stride = this->m_ShaderRecordStride;
        }

        if (!m_CallableShadersRecord.empty())
        {
            CallableShaderBindingTable.pData  = m_Changed ? m_CallableShadersRecord.data() : nullptr;
            CallableShaderBindingTable.Offset = CallableShadersOffset;
            CallableShaderBindingTable.Size   = static_cast<Uint32>(m_CallableShadersRecord.size());
            CallableShaderBindingTable.Stride = this->m_ShaderRecordStride;
        }

        m_Changed = false;
    }